

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O0

bool __thiscall
Am_Gesture_Trainer::Add_Example
          (Am_Gesture_Trainer *this,Am_String *classname,Am_Feature_Vector *fv,bool unique)

{
  int iVar1;
  Am_Gesture_Trainer_Data *pAVar2;
  undefined4 extraout_var;
  Gesture_Class *pGVar3;
  Am_Wrapper *value;
  Am_String local_50;
  Gesture_Class *local_48;
  Gesture_Class *c;
  undefined1 local_29;
  Am_Feature_Vector *pAStack_28;
  bool unique_local;
  Am_Feature_Vector *fv_local;
  Am_String *classname_local;
  Am_Gesture_Trainer *this_local;
  
  local_29 = unique;
  pAStack_28 = fv;
  fv_local = (Am_Feature_Vector *)classname;
  classname_local = (Am_String *)this;
  if (this->data == (Am_Gesture_Trainer_Data *)0x0) {
    pAVar2 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(pAVar2);
    this->data = pAVar2;
  }
  else if (unique) {
    iVar1 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])()
    ;
    this->data = (Am_Gesture_Trainer_Data *)CONCAT44(extraout_var,iVar1);
  }
  pAVar2 = this->data;
  Am_String::Am_String(&local_50,classname);
  pGVar3 = Am_Gesture_Trainer_Data::Find_Class(pAVar2,&local_50);
  Am_String::~Am_String(&local_50);
  if (pGVar3 != (Gesture_Class *)0x0) {
    local_48 = pGVar3;
    value = Am_Feature_Vector::operator_cast_to_Am_Wrapper_(fv);
    Am_Value_List::Add(&pGVar3->examples,value,Am_TAIL,true);
    Am_Gesture_Classifier::operator=
              (&this->data->cached_classifier,(Am_Gesture_Classifier_Data *)0x0);
  }
  return pGVar3 != (Gesture_Class *)0x0;
}

Assistant:

bool
Am_Gesture_Trainer::Add_Example(Am_String classname, Am_Feature_Vector fv,
                                bool unique)
{
  if (!data)
    data = new Am_Gesture_Trainer_Data();
  else if (unique)
    data = (Am_Gesture_Trainer_Data *)data->Make_Unique();

  Am_Gesture_Trainer_Data::Gesture_Class *c = data->Find_Class(classname);
  if (!c)
    return false;

  c->examples.Add(fv);

  data->cached_classifier = nullptr;
  return true;
}